

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void store(item *x,item *y)

{
  int iVar1;
  typeDesc *ptVar2;
  typeDesc *ptVar3;
  int op;
  int r;
  typeDesc *typeY;
  typeDesc *typeX;
  item *y_local;
  item *x_local;
  
  ptVar2 = getType(x->typeIndex);
  ptVar3 = getType(y->typeIndex);
  if (((((ptVar2->form == 800) || (ptVar2->form == 0x321)) || (ptVar2->form == 0x324)) ||
      (ptVar2->form == 0x325)) && (ptVar2->form == ptVar3->form)) {
    if (y->mode == 0x2c3) {
      iVar1 = selectOpNegated(y->c);
      put(iVar1,y->r,0,y->a);
      regs[y->r] = 0;
      y->a = pc + -1;
      fixLink(y->b);
      iVar1 = getReg();
      y->r = iVar1;
      put(0x10,y->r,0,1);
      put(0x28,0,0,2);
      fixLink(y->a);
      put(0x10,y->r,0,0);
    }
    else if ((y->mode != 0x2c2) && (y->mode != 0x2c0)) {
      load(y);
    }
    if (x->mode == 0x2c1) {
      if (x->lev == 0) {
        x->a = RISC_MEMSIZE + x->a;
      }
      if (x->hs == 0) {
        put(0x24,y->r,x->r,x->a);
      }
      else {
        put(0x28,x->hs,0,3);
        put(0x24,y->r,x->r,x->a);
        put(0x28,0,0,2);
        put(0x34,y->r,x->r,x->a);
      }
    }
    else {
      if (x->mode != 0x2c6) {
        mark("illegal assignment");
        exit(-1);
      }
      put(0x34,y->r,x->r,x->a);
    }
    regs[x->hs] = 0;
    regs[y->r] = 0;
    regs[x->r] = 0;
    return;
  }
  mark("incompatible assignment");
  exit(-1);
}

Assistant:

procedure 
void store(struct item *x, struct item *y) {
	variable struct typeDesc *typeX; variable struct typeDesc *typeY;variable int r;
	variable int op;typeX = NULL; typeY = NULL; op = 0; 

	/* get the type of both items */
	typeX = getType(x->typeIndex); typeY = getType(y->typeIndex);

	/* type checking */
	if (((typeX->form == FORM_INT) || (typeX->form == FORM_CHAR) || 
		(typeX->form == FORM_REF) || (typeX->form == FORM_BOOL)) && (typeX->form == typeY->form)) {
		
		/* handle conditon on right hand side of assignment */
		if (y->mode == CLASS_COND) {
			op = selectOpNegated(y->c);
			put(op, y->r, 0, y->a); 
			regs[y->r] = 0; 
			y->a = pc - 1;
			fixLink(y->b); 
			r = getReg();
			y->r = r; 
			put(RISC_ADDI,y->r,0,1); 
			put(RISC_BEQ,0,0,2);
			fixLink(y->a); 
			put(RISC_ADDI,y->r,0,0);
		} elsif ((y->mode != CLASS_REG) && (y->mode != CLASS_PROC)) {
			load(y);
		}
		if (x->mode == CLASS_VAR) {
			if (x->lev == 0) {
				x->a = RISC_MEMSIZE + x->a;
			}
			if (x->hs != 0) { 
				put(RISC_BEQ,x->hs,0,3); 
				put(RISC_STW,y->r,x->r,x->a); 
				put(RISC_BEQ,0,0,2);
				put(RISC_HSTW,y->r,x->r,x->a); 
			} else {
				put(RISC_STW,y->r,x->r,x->a); 
			}
		} elsif (x->mode == CLASS_IND) { 
			put(RISC_HSTW,y->r,x->r,x->a);
		} else {
			mark("illegal assignment");
			exit(-1);
		}
		regs[x->hs] = 0;
		regs[y->r]  = 0;
		regs[x->r]  = 0;
	} else {
		mark("incompatible assignment");
		exit(-1);
	}	
}